

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O3

void __thiscall bitdeque<32768>::erase_front(bitdeque<32768> *this,size_type n)

{
  long lVar1;
  bitset<32768UL> *this_00;
  iterator __last;
  int iVar2;
  ulong uVar3;
  _Elt_pointer pbVar4;
  long lVar5;
  _Map_pointer ppbVar6;
  _Elt_pointer pbVar7;
  difference_type __node_offset;
  ulong uVar8;
  long in_FS_OFFSET;
  iterator in_stack_ffffffffffffff78;
  _Map_pointer in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0x8000 - (long)this->m_pad_begin;
  uVar8 = n - uVar3;
  if (uVar3 <= n) {
    this->m_pad_begin = 0;
    pbVar7 = (this->m_deque).
             super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl
             .super__Deque_impl_data._M_start._M_cur;
    pbVar4 = (this->m_deque).
             super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl
             .super__Deque_impl_data._M_start._M_first;
    ppbVar6 = (this->m_deque).
              super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    lVar5 = ((long)pbVar7 - (long)pbVar4 >> 0xc) + 1;
    if (lVar5 == 0) {
      pbVar7 = pbVar7 + 1;
    }
    else {
      ppbVar6 = ppbVar6 + lVar5;
      pbVar4 = *ppbVar6;
      pbVar7 = pbVar4;
    }
    uVar3 = uVar8 >> 0xf;
    lVar5 = ((long)pbVar7 - (long)pbVar4 >> 0xc) + uVar3;
    if (lVar5 == 0) {
      pbVar7 = pbVar7 + uVar3;
    }
    else {
      ppbVar6 = ppbVar6 + lVar5;
      pbVar7 = *ppbVar6;
    }
    __last._M_first = pbVar7;
    __last._M_cur = (_Elt_pointer)in_stack_ffffffffffffff98;
    __last._M_last = *ppbVar6;
    __last._M_node = (_Map_pointer)(*ppbVar6 + 1);
    std::deque<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>::_M_erase
              ((iterator *)&stack0xffffffffffffff80,&this->m_deque,in_stack_ffffffffffffff78,__last)
    ;
    n = (size_type)((uint)uVar8 & 0x7fff);
  }
  if (n != 0) {
    this_00 = (this->m_deque).
              super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    iVar2 = this->m_pad_begin;
    do {
      std::bitset<32768UL>::reset(this_00,(long)iVar2);
      iVar2 = this->m_pad_begin + 1;
      this->m_pad_begin = iVar2;
      n = n - 1;
    } while (n != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void erase_front(size_type n)
    {
        if (n >= static_cast<size_type>(BITS_PER_WORD - m_pad_begin)) {
            n -= BITS_PER_WORD - m_pad_begin;
            m_pad_begin = 0;
            m_deque.erase(m_deque.begin(), m_deque.begin() + 1 + (n / BITS_PER_WORD));
            n %= BITS_PER_WORD;
        }
        if (n) {
            auto& first = m_deque.front();
            while (n) {
                first.reset(m_pad_begin);
                ++m_pad_begin;
                --n;
            }
        }
    }